

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O2

bool __thiscall TCLAP::SwitchArg::combinedSwitchesMatch(SwitchArg *this,string *combinedSwitches)

{
  char cVar1;
  char cVar2;
  __type _Var3;
  long lVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (combinedSwitches->_M_string_length != 0) {
    cVar1 = *(combinedSwitches->_M_dataplus)._M_p;
    Arg::flagStartString_abi_cxx11_();
    cVar2 = *local_90._M_dataplus._M_p;
    std::__cxx11::string::~string((string *)&local_90);
    if (cVar1 != cVar2) {
      return false;
    }
  }
  Arg::nameStartString_abi_cxx11_();
  std::__cxx11::string::substr((ulong)&local_90,(ulong)combinedSwitches);
  Arg::nameStartString_abi_cxx11_();
  _Var3 = std::operator==(&local_90,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  if (!_Var3) {
    lVar4 = std::__cxx11::string::find
                      ((char)combinedSwitches,(ulong)(uint)(int)Arg::delimiterRef()::delim);
    if (lVar4 != -1) {
      return false;
    }
    for (uVar5 = 1; uVar5 < combinedSwitches->_M_string_length; uVar5 = (ulong)((int)uVar5 + 1)) {
      if (((this->super_Arg)._flag._M_string_length != 0) &&
         (cVar1 = (combinedSwitches->_M_dataplus)._M_p[uVar5],
         cVar1 == *(this->super_Arg)._flag._M_dataplus._M_p)) {
        Arg::flagStartString_abi_cxx11_();
        cVar2 = *local_90._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&local_90);
        if (cVar1 != cVar2) {
          (combinedSwitches->_M_dataplus)._M_p[uVar5] = '\a';
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::combinedSwitchesMatch(std::string& combinedSwitches )
{
	// make sure this is actually a combined switch
	if ( combinedSwitches.length() > 0 &&
	     combinedSwitches[0] != Arg::flagStartString()[0] )
		return false;

	// make sure it isn't a long name 
	if ( combinedSwitches.substr( 0, Arg::nameStartString().length() ) == 
	     Arg::nameStartString() )
		return false;

	// make sure the delimiter isn't in the string 
	if ( combinedSwitches.find_first_of( Arg::delimiter() ) != std::string::npos )
		return false;

	// ok, we're not specifying a ValueArg, so we know that we have
	// a combined switch list.  
	for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
		if ( _flag.length() > 0 && 
		     combinedSwitches[i] == _flag[0] &&
		     _flag[0] != Arg::flagStartString()[0] ) 
		{
			// update the combined switches so this one is no longer present
			// this is necessary so that no unlabeled args are matched
			// later in the processing.
			//combinedSwitches.erase(i,1);
			combinedSwitches[i] = Arg::blankChar(); 
			return true;
		}

	// none of the switches passed in the list match. 
	return false;	
}